

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

void __thiscall
tonk::SessionOutgoing::sendQueuedDatagram
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint sequenceNumberBytes,
          uint sequenceNumber)

{
  uint8_t *data;
  SimpleCipher *this_00;
  bool bVar1;
  undefined4 uVar2;
  ulong uVar3;
  IUDPSender *pIVar4;
  SenderBandwidthControl *pSVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint8_t *puVar8;
  uint64_t uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  
  uVar14 = datagram->NextWriteOffset;
  uVar16 = (ulong)uVar14;
  data = datagram->Data;
  if (((this->Deps).EnablePadding == true) &&
     (uVar12 = (this->super_OutgoingQueueCommon).MaxMessageSectionBytes, uVar14 + 2 <= uVar12)) {
    uVar3 = (this->PaddingPRNG).State;
    (this->PaddingPRNG).State = uVar3 * 0x5851f42d4c957f2d + (this->PaddingPRNG).Inc;
    uVar11 = (uint)(uVar3 >> 0x2d) ^ (uint)(uVar3 >> 0x1b);
    bVar10 = (byte)(uVar3 >> 0x3b);
    uVar15 = uVar12 - uVar14;
    if (uVar14 + (byte)TONK_RAND_PAD_EXP[(uVar11 >> bVar10 | uVar11 << 0x20 - bVar10) & 0xff] <=
        uVar12) {
      uVar15 = (uint)(byte)TONK_RAND_PAD_EXP[(uVar11 >> bVar10 | uVar11 << 0x20 - bVar10) & 0xff];
    }
    if (1 < uVar15) {
      *(ushort *)(datagram->Data + uVar16 + 2 + -2) = (ushort)(uVar15 - 2) | 0x2000;
      memset(datagram->Data + uVar16 + 2,0,(ulong)(uVar15 - 2));
      uVar16 = (ulong)(uVar15 + uVar14);
    }
  }
  bVar1 = this->ShouldCompressSequenceNumbers;
  puVar8 = data + uVar16;
  bVar10 = bVar1 << 5 | 0x80;
  if (sequenceNumberBytes != 0) {
    bVar10 = bVar10 | (byte)sequenceNumberBytes;
    *(uint *)puVar8 = sequenceNumber;
    puVar8 = puVar8 + sequenceNumberBytes;
  }
  uVar9 = this->NextNonce;
  this->NextNonce = uVar9 + 1;
  uVar14 = 3;
  if (bVar1 != false) {
    uVar12 = (uint)uVar9 - (int)(this->LastAck).PeerNextExpectedNonce.Value;
    uVar14 = 0;
    if (uVar12 != 1) {
      uVar14 = 1;
      uVar15 = -uVar12;
      if (0 < (int)uVar12) {
        uVar15 = uVar12;
      }
      if (0x7e < uVar15) {
        uVar14 = 3 - (uVar15 < 0x7fff);
      }
    }
  }
  *(uint *)puVar8 = (uint)uVar9;
  puVar8 = puVar8 + uVar14;
  bVar10 = (char)uVar14 * '\x04' | bVar10;
  if (((this->ShouldAttachHandshake)._M_base._M_i & 1U) != 0) {
    uVar2 = *(undefined4 *)(this->Handshake + 8);
    bVar10 = bVar10 | 0x40;
    *(undefined8 *)puVar8 = *(undefined8 *)this->Handshake;
    *(undefined4 *)(puVar8 + 8) = uVar2;
    puVar8 = puVar8 + 0xc;
  }
  this_00 = &this->Encryptor;
  puVar8[3] = bVar10;
  uVar14 = (int)puVar8 - (int)data;
  security::SimpleCipher::Cipher(this_00,data,(uint)uVar16,uVar9);
  uVar6 = security::SimpleCipher::Tag(this_00,data,uVar14,uVar9);
  iVar13 = uVar14 + 6;
  uVar9 = siamese::GetTimeUsec();
  uVar7 = security::SimpleCipher::TagInt(this_00,(uint)bVar10 | (int)(uVar9 >> 3) << 8);
  puVar8[2] = (char)(uVar9 >> 0x13);
  *(short *)puVar8 = (short)(uVar9 >> 3);
  *(uint16_t *)(puVar8 + 4) = uVar7 ^ uVar6;
  uVar14 = datagram->CompressionSavings;
  pIVar4 = (this->Deps).UDPSender;
  (*pIVar4->_vptr_IUDPSender[2])(pIVar4,&this->PeerUDPAddress,(this->Deps).ConnectionRef);
  pSVar5 = (this->Deps).SenderControl;
  LOCK();
  (pSVar5->AvailableTokens).super___atomic_base<int>._M_i =
       (pSVar5->AvailableTokens).super___atomic_base<int>._M_i - iVar13;
  UNLOCK();
  if (sequenceNumberBytes != 0) {
    pSVar5->RecoverySendTokens = pSVar5->RecoverySendTokens + 0x400;
  }
  pSVar5->ProbeSendTokens = pSVar5->ProbeSendTokens + uVar14 + iVar13;
  return;
}

Assistant:

void SessionOutgoing::sendQueuedDatagram(
    OutgoingQueuedDatagram* datagram,
    unsigned sequenceNumberBytes,
    unsigned sequenceNumber)
{
    // If this function changes, also update PostRecovery() and PostDummyDatagram() to keep it in sync.

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = datagram->NextWriteOffset;

    TONK_DEBUG_ASSERT(messageBytes > 0);

#ifdef TONK_ENABLE_RANDOM_PADDING
    unsigned paddingBytes = 0;

    // If there is room for one more message in the datagram:
    if (Deps.EnablePadding &&
        messageBytes + protocol::kMessageFrameBytes <= MaxMessageSectionBytes)
    {
        // Select the number of bytes to pad
        unsigned targetPadBytes = TONK_RAND_PAD_EXP[PaddingPRNG.Next() % 256];

        TONK_DEBUG_ASSERT(targetPadBytes <= protocol::kMaxRandomPaddingBytes);
        if (messageBytes + targetPadBytes > MaxMessageSectionBytes) {
            targetPadBytes = MaxMessageSectionBytes - messageBytes;
        }

        // If there is at least a frame worth of padding:
        if (targetPadBytes >= protocol::kMessageFrameBytes)
        {
            // Write frame header
            protocol::WriteMessageFrameHeader(
                datagramData + messageBytes,
                protocol::MessageType_Padding,
                targetPadBytes - protocol::kMessageFrameBytes);

            // Zero the padding bytes to avoid sending confidential data
            memset(
                datagramData + messageBytes + protocol::kMessageFrameBytes,
                0,
                targetPadBytes - protocol::kMessageFrameBytes);

            paddingBytes += targetPadBytes;
            messageBytes += targetPadBytes;
        }
    }
#endif // TONK_ENABLE_RANDOM_PADDING

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    if (sequenceNumberBytes > 0)
    {
        flags |= sequenceNumberBytes;
        protocol::WriteFooterField(footer, sequenceNumber, sequenceNumberBytes);
        footer += sequenceNumberBytes;
    }

    // Write packet nonce to header
    unsigned nonceBytes;
    const NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    // Encrypt message data but not the footer
    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Generate the main packet data tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

    TONK_VERBOSE_OUTGOING_LOG("sendQueuedDatagram: datagram = ", datagram, " sequenceNumber=",
        sequenceNumber, " sequenceNumberBytes=", sequenceNumberBytes, " bytes=", datagramBuffer.Bytes);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    for (int i = 0; i < Stats_QueueCount; ++i) {
        stats->Stats[i] += datagram->Stats[i];
    }
    stats->Stats[Stats_PaddingBytesSent] += paddingBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    const unsigned compressionSavings = datagram->CompressionSavings;

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        compressionSavings,
        sendBytes,
        sequenceNumberBytes > 0);
}